

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void lambert_textured_lighting(vec3f light_dir,Model *model,TGAImage *image)

{
  double dVar1;
  array<vec<3UL,_int>,_3UL> pts;
  array<vec<2UL,_double>,_3UL> uvs;
  double *pdVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int j;
  size_t i;
  ulong iface;
  double *pdVar7;
  size_t w;
  size_t y;
  double *pdVar8;
  vec2f vVar9;
  vec<3UL,_double> ret_1;
  vec<3UL,_double> ret;
  TGAImage depth;
  array<vec<3UL,_int>,_3UL> screen_coords;
  array<vec<2UL,_double>,_3UL> uv_coords;
  vec3f local_198;
  double local_178 [4];
  double local_158 [3];
  TGAImage *local_140;
  undefined1 local_138 [24];
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  int local_c8;
  string local_b8;
  vec3f local_98;
  vector<double,_std::allocator<double>_> local_80;
  double local_68 [7];
  
  local_140 = image;
  pdVar2 = (double *)operator_new(0x2bf200);
  local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar2 + 360000;
  lVar4 = 0;
  do {
    pdVar2[lVar4] = -1.79769313486232e+308;
    (pdVar2 + lVar4)[1] = -1.79769313486232e+308;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 360000);
  iface = 0;
  local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar2;
  local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  while( true ) {
    sVar3 = Model::nfaces(model);
    if (sVar3 <= iface) break;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_c8 = 0;
    local_108 = 0.0;
    dStack_100 = 0.0;
    local_118 = 0.0;
    dStack_110 = 0.0;
    local_138._16_8_ = (pointer)0x0;
    dStack_120 = 0.0;
    local_138._0_8_ = (pointer)0x0;
    local_138._8_8_ = (pointer)0x0;
    local_f8 = 0.0;
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    local_68[2] = 0.0;
    local_68[3] = 0.0;
    local_68[4] = 0.0;
    local_68[5] = 0.0;
    pdVar8 = local_68 + 1;
    lVar4 = 0;
    sVar3 = 0;
    do {
      Model::vert(&local_98,model,iface,sVar3);
      iVar6 = (int)local_98.z;
      *(ulong *)((long)&local_e8 + lVar4) =
           CONCAT44((int)((local_98.y + 1.0) * 600.0 * 0.5 + 0.5),
                    (int)((local_98.x + 1.0) * 600.0 * 0.5 + 0.5));
      *(int *)((long)&uStack_e0 + lVar4) = iVar6;
      Model::vert(&local_198,model,iface,sVar3);
      *(double *)(local_138 + lVar4 * 2 + 0x10) = local_198.z;
      *(double *)(local_138 + lVar4 * 2) = local_198.x;
      *(double *)(local_138 + lVar4 * 2 + 8) = local_198.y;
      vVar9 = Model::uv(model,iface,sVar3);
      pdVar8[-1] = vVar9.x;
      *pdVar8 = vVar9.y;
      sVar3 = sVar3 + 1;
      lVar4 = lVar4 + 0xc;
      pdVar8 = pdVar8 + 2;
    } while (sVar3 != 3);
    local_158[2] = local_f8;
    local_158[0] = local_108;
    local_158[1] = dStack_100;
    lVar4 = 3;
    do {
      dVar1 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)local_138,lVar4 - 1);
      lVar5 = 0;
      if (lVar4 != 1) {
        lVar5 = (ulong)(lVar4 != 2) * 8 + 8;
      }
      *(double *)((long)local_158 + lVar5) = *(double *)((long)local_158 + lVar5) - dVar1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    local_178[2] = dStack_110;
    local_178[0] = dStack_120;
    local_178[1] = local_118;
    lVar4 = 3;
    do {
      dVar1 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)local_138,lVar4 - 1);
      lVar5 = 0;
      if (lVar4 != 1) {
        lVar5 = (ulong)(lVar4 != 2) * 8 + 8;
      }
      *(double *)((long)local_178 + lVar5) = *(double *)((long)local_178 + lVar5) - dVar1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    local_198.x = local_178[2] * local_158[1] - local_158[2] * local_178[1];
    local_198.y = local_178[0] * local_158[2] - local_158[0] * local_178[2];
    local_198.z = local_158[0] * local_178[1] - local_178[0] * local_158[1];
    vec<3UL,_double>::normalize(&local_198);
    dVar1 = dot<3ul,double>(&local_198,&light_dir);
    if (0.0 < dVar1) {
      pts._M_elems[0].z = (undefined4)uStack_e0;
      pts._M_elems[1].x = uStack_e0._4_4_;
      pts._M_elems[0].x = (undefined4)local_e8;
      pts._M_elems[0].y = local_e8._4_4_;
      pts._M_elems[1].y = (undefined4)local_d8;
      pts._M_elems[1].z = local_d8._4_4_;
      pts._M_elems[2].x = (undefined4)uStack_d0;
      pts._M_elems[2].y = uStack_d0._4_4_;
      pts._M_elems[2].z = local_c8;
      uvs._M_elems[0].y = local_68[1];
      uvs._M_elems[0].x = local_68[0];
      uvs._M_elems[1].x = local_68[2];
      uvs._M_elems[1].y = local_68[3];
      uvs._M_elems[2].x = local_68[4];
      uvs._M_elems[2].y = local_68[5];
      triangle_textured(pts,uvs,&local_80,local_140,model);
    }
    iface = iface + 1;
  }
  TGAImage::TGAImage((TGAImage *)local_138,600,600,1);
  sVar3 = 0;
  pdVar8 = pdVar2;
  do {
    y = 0;
    pdVar7 = pdVar8;
    do {
      local_198.x._0_5_ = CONCAT41(0x1000000,(char)(int)((*pdVar7 + 1.0) * 128.0));
      TGAImage::set((TGAImage *)local_138,sVar3,y,(TGAColor *)&local_198);
      y = y + 1;
      pdVar7 = pdVar7 + 600;
    } while (y != 600);
    sVar3 = sVar3 + 1;
    pdVar8 = pdVar8 + 1;
  } while (sVar3 != 600);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"depth.tga","");
  TGAImage::write_tga_file((TGAImage *)local_138,&local_b8,true,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_138._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
  }
  operator_delete(pdVar2,0x2bf200);
  return;
}

Assistant:

void lambert_textured_lighting(vec3f light_dir, Model &model, TGAImage &image)
{
    std::vector<double> zbuffer(width * height, -std::numeric_limits<double>::max());
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec3i, 3> screen_coords;
        std::array<vec3f, 3> world_coords;
        std::array<vec2f, 3> uv_coords;
        for (int j = 0; j < 3; j++) {
            screen_coords[j] = world2screen(model.vert(i, j));
            world_coords[j] = model.vert(i, j);
            uv_coords[j] = model.uv(i, j);
        }
        vec3f n = cross(world_coords[2] - world_coords[0], world_coords[1] - world_coords[0]);
        n.normalize();
        double intensity = dot(n, light_dir);

        if (intensity > 0) {
            triangle_textured(screen_coords, uv_coords, zbuffer, image, model);
        }
    }
    TGAImage depth(width, height, TGAImage::GRAYSCALE);
    for (size_t h = 0; h < height; h++)
        for (size_t w = 0; w < width; w++)
            depth.set(h, w, static_cast<uint8_t>((zbuffer[w * height + h] + 1) * 128));

    depth.write_tga_file("depth.tga");
}